

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O0

void av1_tokenize_color_map
               (MACROBLOCK *x,int plane,TokenExtra **t,BLOCK_SIZE bsize,TX_SIZE tx_size,
               COLOR_MAP_TYPE type,int allow_update_cdf,FRAME_COUNTS *counts)

{
  byte *pbVar1;
  int in_ECX;
  MACROBLOCK *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  TokenExtra **unaff_retaddr;
  Av1ColorMapParam *in_stack_00000008;
  Av1ColorMapParam color_map_params;
  byte *local_38;
  
  get_color_map_params
            (in_RDX,in_ECX,(BLOCK_SIZE)((uint)in_R8D >> 0x18),(TX_SIZE)((uint)in_R8D >> 0x10),
             (COLOR_MAP_TYPE)((uint)in_R8D >> 8),(Av1ColorMapParam *)0x31c53d);
  pbVar1 = (byte *)in_RDX->plane[0].src_diff;
  *pbVar1 = *pbVar1 & 0xf8 | *local_38 & 7;
  pbVar1 = (byte *)in_RDX->plane[0].src_diff;
  *pbVar1 = *pbVar1 & 0xf | 0xf0;
  in_RDX->plane[0].src_diff = (int16_t *)((long)in_RDX->plane[0].src_diff + 1);
  cost_and_tokenize_map
            (in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,
             (FRAME_COUNTS *)in_RDX);
  return;
}

Assistant:

void av1_tokenize_color_map(const MACROBLOCK *const x, int plane,
                            TokenExtra **t, BLOCK_SIZE bsize, TX_SIZE tx_size,
                            COLOR_MAP_TYPE type, int allow_update_cdf,
                            FRAME_COUNTS *counts) {
  assert(plane == 0 || plane == 1);
  Av1ColorMapParam color_map_params;
  get_color_map_params(x, plane, bsize, tx_size, type, &color_map_params);
  // The first color index does not use context or entropy.
  (*t)->token = color_map_params.color_map[0];
  (*t)->color_ctx = -1;
  ++(*t);
  cost_and_tokenize_map(&color_map_params, t, plane, 0, allow_update_cdf,
                        counts);
}